

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logger.cc
# Opt level: O2

void SimpleLoggerMgr::compressWorker(void)

{
  const_iterator __position;
  pthread_t __target_thread;
  SimpleLoggerMgr *this;
  _List_node_base *p_Var1;
  lock_guard<std::mutex> l;
  list<SimpleLoggerMgr::CompElem_*,_std::allocator<SimpleLoggerMgr::CompElem_*>_> *this_00;
  bool bVar2;
  
  __target_thread = pthread_self();
  pthread_setname_np(__target_thread,"sl_compressor");
  this = get();
  this_00 = &this->pendingCompElems;
  bVar2 = true;
  while (((this->termination)._M_base._M_i & 1U) == 0) {
    if (bVar2) {
      sleepCompressor(this,500);
    }
    std::mutex::lock(&this->pendingCompElemsLock);
    __position._M_node =
         (this_00->
         super__List_base<SimpleLoggerMgr::CompElem_*,_std::allocator<SimpleLoggerMgr::CompElem_*>_>
         )._M_impl._M_node.super__List_node_base._M_next;
    if (__position._M_node == (_List_node_base *)this_00) {
      p_Var1 = (_List_node_base *)0x0;
    }
    else {
      p_Var1 = __position._M_node[1]._M_next;
      std::__cxx11::list<SimpleLoggerMgr::CompElem_*,_std::allocator<SimpleLoggerMgr::CompElem_*>_>
      ::erase(this_00,__position);
    }
    pthread_mutex_unlock((pthread_mutex_t *)&this->pendingCompElemsLock);
    bVar2 = p_Var1 == (_List_node_base *)0x0;
    if (!bVar2) {
      SimpleLogger::doCompression((SimpleLogger *)p_Var1->_M_prev,(size_t)p_Var1->_M_next);
      operator_delete(p_Var1);
    }
  }
  return;
}

Assistant:

void SimpleLoggerMgr::compressWorker() {
#ifdef __linux__
    pthread_setname_np(pthread_self(), "sl_compressor");
#endif
    SimpleLoggerMgr* mgr = SimpleLoggerMgr::get();
    bool sleep_next_time = true;
    while (!mgr->chkTermination()) {
        // Every 500ms.
        size_t sub_ms = 500;
        if (sleep_next_time) {
            mgr->sleepCompressor(sub_ms);
        }
        sleep_next_time = true;

        CompElem* elem = nullptr;
        {   std::lock_guard<std::mutex> l(mgr->pendingCompElemsLock);
            auto entry = mgr->pendingCompElems.begin();
            if (entry != mgr->pendingCompElems.end()) {
                elem = *entry;
                mgr->pendingCompElems.erase(entry);
            }
        }

        if (elem) {
            elem->targetLogger->doCompression(elem->fileNum);
            delete elem;
            // Continuous compression if pending item exists.
            sleep_next_time = false;
        }
    }
}